

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O3

void polyscope::pushContext(function<void_()> *callbackFunction,bool drawDefaultUI)

{
  _Any_data *this;
  unsigned_short *puVar1;
  int iVar2;
  ImFontAtlas *shared_font_atlas;
  ImGuiContext *ctx;
  ImGuiIO *__src;
  ImGuiIO *pIVar3;
  unsigned_short *puVar4;
  runtime_error *this_00;
  int iVar5;
  ulong uVar6;
  undefined1 local_60 [24];
  code *local_48;
  undefined1 local_38;
  
  shared_font_atlas = render::Engine::getImGuiGlobalFontAtlas(render::engine);
  ctx = ImGui::CreateContext(shared_font_atlas);
  __src = ImGui::GetIO();
  ImGui::SetCurrentContext(ctx);
  render::Engine::setImGuiStyle(render::engine);
  pIVar3 = ImGui::GetIO();
  memcpy(pIVar3,__src,0x154a);
  puVar4 = (pIVar3->InputQueueCharacters).Data;
  if (puVar4 != (unsigned_short *)0x0) {
    (pIVar3->InputQueueCharacters).Size = 0;
    (pIVar3->InputQueueCharacters).Capacity = 0;
    ImGui::MemFree(puVar4);
    (pIVar3->InputQueueCharacters).Data = (unsigned_short *)0x0;
  }
  iVar2 = (__src->InputQueueCharacters).Size;
  iVar5 = (pIVar3->InputQueueCharacters).Capacity;
  if (iVar5 < iVar2) {
    if (iVar5 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar5 / 2 + iVar5;
    }
    if (iVar5 <= iVar2) {
      iVar5 = iVar2;
    }
    puVar4 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
    puVar1 = (pIVar3->InputQueueCharacters).Data;
    if (puVar1 != (unsigned_short *)0x0) {
      memcpy(puVar4,puVar1,(long)(pIVar3->InputQueueCharacters).Size * 2);
      ImGui::MemFree((pIVar3->InputQueueCharacters).Data);
    }
    (pIVar3->InputQueueCharacters).Data = puVar4;
    (pIVar3->InputQueueCharacters).Capacity = iVar5;
  }
  else {
    puVar4 = (unsigned_short *)0x0;
  }
  (pIVar3->InputQueueCharacters).Size = iVar2;
  memcpy(puVar4,(__src->InputQueueCharacters).Data,(long)iVar2 * 2);
  this = (_Any_data *)(local_60 + 8);
  local_60._0_8_ = ctx;
  std::function<void_()>::function((function<void_()> *)this,callbackFunction);
  local_38 = drawDefaultUI;
  std::
  vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
  ::push_back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
               *)local_60,(value_type *)callbackFunction);
  if (local_48 != (code *)0x0) {
    (*local_48)(this,this,__destroy_functor);
  }
  if ((ulong)((DAT_004baba0 - (anonymous_namespace)::contextStack >> 4) * -0x5555555555555555) <
      0x33) {
    (*render::engine->_vptr_Engine[0xf])();
    uVar6 = DAT_004baba0 - (anonymous_namespace)::contextStack;
    do {
      mainLoopIteration();
      iVar2 = (*render::engine->_vptr_Engine[0x13])();
      if ((char)iVar2 != '\0') {
        popContext();
      }
    } while (uVar6 <= (ulong)(DAT_004baba0 - (anonymous_namespace)::contextStack));
    pIVar3 = ImGui::GetIO();
    memcpy(__src,pIVar3,0x154a);
    puVar4 = (__src->InputQueueCharacters).Data;
    if (puVar4 != (unsigned_short *)0x0) {
      (__src->InputQueueCharacters).Size = 0;
      (__src->InputQueueCharacters).Capacity = 0;
      ImGui::MemFree(puVar4);
      (__src->InputQueueCharacters).Data = (unsigned_short *)0x0;
    }
    iVar2 = (pIVar3->InputQueueCharacters).Size;
    iVar5 = (__src->InputQueueCharacters).Capacity;
    if (iVar5 < iVar2) {
      if (iVar5 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar5 / 2 + iVar5;
      }
      if (iVar5 <= iVar2) {
        iVar5 = iVar2;
      }
      puVar4 = (unsigned_short *)ImGui::MemAlloc((long)iVar5 * 2);
      puVar1 = (__src->InputQueueCharacters).Data;
      if (puVar1 != (unsigned_short *)0x0) {
        memcpy(puVar4,puVar1,(long)(__src->InputQueueCharacters).Size * 2);
        ImGui::MemFree((__src->InputQueueCharacters).Data);
      }
      (__src->InputQueueCharacters).Data = puVar4;
      (__src->InputQueueCharacters).Capacity = iVar5;
    }
    else {
      puVar4 = (unsigned_short *)0x0;
    }
    (__src->InputQueueCharacters).Size = iVar2;
    memcpy(puVar4,(pIVar3->InputQueueCharacters).Data,(long)iVar2 * 2);
    ImGui::DestroyContext(ctx);
    if ((anonymous_namespace)::contextStack != DAT_004baba0) {
      ImGui::SetCurrentContext(*(ImGuiContext **)(DAT_004baba0 + -0x30));
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps you are accidentally calling show every time polyscope::userCallback executes?"
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void pushContext(std::function<void()> callbackFunction, bool drawDefaultUI) {

  // Create a new context and push it on to the stack
  ImGuiContext* newContext = ImGui::CreateContext(render::engine->getImGuiGlobalFontAtlas());
  ImGuiIO& oldIO = ImGui::GetIO(); // used to copy below, see note
  ImGui::SetCurrentContext(newContext);

  render::engine->setImGuiStyle();
  ImGui::GetIO() = oldIO; // Copy all of the old IO values to new. With ImGUI 1.76 (and some previous versions), this
                          // was necessary to fix a bug where keys like delete, etc would break in subcontexts. The
                          // problem was that the key mappings (e.g. GLFW_KEY_BACKSPACE --> ImGuiKey_Backspace) need to
                          // be populated in io.KeyMap, and these entries would get lost on creating a new context.
  contextStack.push_back(ContextEntry{newContext, callbackFunction, drawDefaultUI});

  if (contextStack.size() > 50) {
    // Catch bugs with nested show()
    throw std::runtime_error(
        "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps "
        "you are accidentally calling show every time polyscope::userCallback executes?");
  };

  // Make sure the window is visible
  render::engine->showWindow();

  // Re-enter main loop until the context has been popped
  size_t currentContextStackSize = contextStack.size();
  while (contextStack.size() >= currentContextStackSize) {

    mainLoopIteration();

    // auto-exit if the window is closed
    if (render::engine->windowRequestsClose()) {
      popContext();
    }
  }

  oldIO = ImGui::GetIO(); // Copy new IO values to old. I haven't encountered anything that strictly requires this, but
                          // it feels like we should mirror the behavior from pushing.

  ImGui::DestroyContext(newContext);

  // Restore the previous context, if there was one
  if (!contextStack.empty()) {
    ImGui::SetCurrentContext(contextStack.back().context);
  }
}